

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

OPJ_BOOL opj_jp2_read_bpcc(opj_jp2_t *jp2,OPJ_BYTE *p_bpc_header_data,OPJ_UINT32 p_bpc_header_size,
                          opj_event_mgr_t *p_manager)

{
  long lVar1;
  ulong uVar2;
  OPJ_BOOL OVar3;
  
  if (p_bpc_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_bpc_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x2da,
                  "OPJ_BOOL opj_jp2_read_bpcc(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      if (jp2->bpc != 0xff) {
        opj_event_msg(p_manager,2,
                      "A BPCC header box is available although BPC given by the IHDR box (%d) indicate components bit depth is constant\n"
                     );
      }
      if (jp2->numcomps == p_bpc_header_size) {
        lVar1 = 8;
        OVar3 = 1;
        for (uVar2 = 0; uVar2 < p_bpc_header_size; uVar2 = uVar2 + 1) {
          opj_read_bytes_LE(p_bpc_header_data + uVar2,
                            (OPJ_UINT32 *)((long)&jp2->comps->depth + lVar1),1);
          p_bpc_header_size = jp2->numcomps;
          lVar1 = lVar1 + 0xc;
        }
      }
      else {
        OVar3 = 0;
        opj_event_msg(p_manager,1,"Bad BPCC header box (bad size)\n");
      }
      return OVar3;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x2dc,
                  "OPJ_BOOL opj_jp2_read_bpcc(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("jp2 != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x2db,
                "OPJ_BOOL opj_jp2_read_bpcc(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_read_bpcc(opj_jp2_t *jp2,
                                  OPJ_BYTE * p_bpc_header_data,
                                  OPJ_UINT32 p_bpc_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 i;

    /* preconditions */
    assert(p_bpc_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);


    if (jp2->bpc != 255) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "A BPCC header box is available although BPC given by the IHDR box (%d) indicate components bit depth is constant\n",
                      jp2->bpc);
    }

    /* and length is relevant */
    if (p_bpc_header_size != jp2->numcomps) {
        opj_event_msg(p_manager, EVT_ERROR, "Bad BPCC header box (bad size)\n");
        return OPJ_FALSE;
    }

    /* read info for each component */
    for (i = 0; i < jp2->numcomps; ++i) {
        opj_read_bytes(p_bpc_header_data, &jp2->comps[i].bpcc,
                       1);  /* read each BPCC component */
        ++p_bpc_header_data;
    }

    return OPJ_TRUE;
}